

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

undefined4 __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::Value
          (RockSampleMMAPStateScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  byte bVar1;
  int iVar2;
  pointer ppSVar3;
  State *state;
  pointer pvVar4;
  pointer pCVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int r;
  uint uVar12;
  long lVar13;
  double dVar14;
  int local_7c;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> expected_sampling_value;
  undefined4 local_40 [4];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&expected_sampling_value,(long)this->rs_model_->num_rocks_,(allocator_type *)&local_78)
  ;
  local_7c = -1;
  despot::Coord::Coord((Coord *)&local_78,-1,-1);
  local_70 = 0.0;
  uVar12 = 0;
  for (uVar9 = 0;
      ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(particles->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3);
      uVar9 = uVar9 + 1) {
    state = ppSVar3[uVar9];
    bVar1 = (byte)this->rs_model_->num_rocks_;
    uVar12 = (*(uint *)(state + 0xc) >> (bVar1 & 0x1f)) << (bVar1 & 0x1f);
    local_78 = BaseRockSample::GetRobPos(this->rs_model_,state);
    uVar11 = this->rs_model_->num_rocks_;
    uVar7 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar7 = 0;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] =
           *(double *)(state + 0x18) *
           *(double *)
            (&DAT_00117060 + (ulong)((*(uint *)(state + 0xc) >> ((uint)uVar8 & 0x1f) & 1) == 0) * 8)
           + expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    }
    local_70 = local_70 + *(double *)(state + 0x18);
  }
  uVar11 = this->rs_model_->num_rocks_;
  uVar9 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar9 = 0;
  }
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    uVar11 = 1 << ((byte)uVar7 & 0x1f);
    if (expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] / local_70 <= 0.0) {
      uVar11 = 0;
    }
    uVar12 = uVar12 | uVar11;
  }
  local_68 = 1.0;
  local_60 = 0.0;
  uVar9 = 0;
  while( true ) {
    pvVar4 = (this->rock_order_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = *(long *)&pvVar4[(int)uVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar4[(int)uVar12].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + 8) - lVar13 >> 2) <= uVar9) break;
    lVar13 = (long)*(int *)(lVar13 + uVar9 * 4);
    pCVar5 = (this->rs_model_->rock_pos_).
             super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *(int *)(pCVar5 + lVar13 * 8);
    iVar2 = *(int *)(pCVar5 + lVar13 * 8 + 4);
    if (local_7c == -1) {
      local_7c = 3;
      if ((int)local_78 <= iVar10) {
        local_7c = 1;
        if (iVar10 <= (int)local_78) {
          local_7c = 2;
          if (local_78._4_4_ <= iVar2) {
            local_7c = (uint)(iVar2 <= local_78._4_4_) << 2;
          }
        }
      }
    }
    iVar6 = despot::Coord::ManhattanDistance(CONCAT44(iVar2,iVar10),local_78);
    dVar14 = pow(_ParticleBelief,(double)iVar6);
    local_68 = local_68 * dVar14;
    local_60 = local_60 +
               expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13] * local_68;
    local_78 = CONCAT44(iVar2,iVar10);
    uVar9 = uVar9 + 1;
  }
  dVar14 = pow(_ParticleBelief,(double)(this->grid_->xsize_ - (int)local_78));
  iVar10 = 1;
  if (local_7c != -1) {
    iVar10 = local_7c;
  }
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)local_40,iVar10,dVar14 * local_70 * 10.0 * local_68 + local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>);
  return local_40[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		int state = 0;
		Coord rob_pos(-1, -1);
		double total_weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			state = (1 << rs_model_->num_rocks_)
				* rs_model_->GetRobPosIndex(particle);
			rob_pos = rs_model_->GetRobPos(particle);
			for (int r = 0; r < rs_model_->num_rocks_; r++) {
				expected_sampling_value[r] += particle->weight
					* (CheckFlag(particle->state_id, r) ? 10 : -10);
			}
			total_weight += particle->weight;
		}

		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			if (expected_sampling_value[rock] / total_weight > 0.0)
				SetFlag(state, rock);

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		for (int r = 0; r < rock_order_[state].size(); r++) {
			int rock = rock_order_[state][r];
			Coord rock_pos = rs_model_->rock_pos_[rock];

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[rock];
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * total_weight * discount
			* Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}